

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.cxx
# Opt level: O3

size_type cmGeneratorExpression::Find(string *input)

{
  size_type sVar1;
  long lVar2;
  
  sVar1 = std::__cxx11::string::find((char *)input,0x543879,0);
  if ((sVar1 != 0xffffffffffffffff) &&
     (lVar2 = std::__cxx11::string::find((char)input,0x3e), lVar2 != -1)) {
    return sVar1;
  }
  return 0xffffffffffffffff;
}

Assistant:

std::string::size_type cmGeneratorExpression::Find(const std::string& input)
{
  const std::string::size_type openpos = input.find("$<");
  if (openpos != std::string::npos &&
      input.find('>', openpos) != std::string::npos) {
    return openpos;
  }
  return std::string::npos;
}